

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.c
# Opt level: O0

void copy_abbrev_table_to_new_table(Dwarf_Hash_Table htin,Dwarf_Hash_Table htout)

{
  Dwarf_Abbrev_List_conflict *ppDVar1;
  Dwarf_Abbrev_List_conflict pDVar2;
  Dwarf_Abbrev_List_conflict *ppDVar3;
  unsigned_long uVar4;
  Dwarf_Abbrev_List pDVar5;
  ulong uVar6;
  Dwarf_Unsigned newhash;
  Dwarf_Unsigned newtmp;
  Dwarf_Abbrev_List_conflict nextlistent;
  Dwarf_Abbrev_List_conflict listent;
  unsigned_long k;
  unsigned_long entry_out_count;
  Dwarf_Abbrev_List_conflict *entry_out;
  unsigned_long entry_in_count;
  Dwarf_Abbrev_List_conflict *entry_in;
  Dwarf_Hash_Table htout_local;
  Dwarf_Hash_Table htin_local;
  
  ppDVar1 = htin->tb_entries;
  pDVar2 = (Dwarf_Abbrev_List_conflict)htin->tb_table_entry_count;
  ppDVar3 = htout->tb_entries;
  uVar4 = htout->tb_table_entry_count;
  for (listent = (Dwarf_Abbrev_List_conflict)0x0; listent < pDVar2;
      listent = (Dwarf_Abbrev_List_conflict)((long)&listent->abl_code + 1)) {
    nextlistent = ppDVar1[(long)listent];
    while (nextlistent != (Dwarf_Abbrev_List_conflict)0x0) {
      uVar6 = nextlistent->abl_code & uVar4 - 1;
      pDVar5 = nextlistent->abl_next;
      if (htout->tb_highest_used_entry < uVar6) {
        htout->tb_highest_used_entry = uVar6;
      }
      nextlistent->abl_next = ppDVar3[uVar6];
      ppDVar3[uVar6] = nextlistent;
      htout->tb_total_abbrev_count = htout->tb_total_abbrev_count + 1;
      nextlistent = pDVar5;
    }
  }
  return;
}

Assistant:

static void
copy_abbrev_table_to_new_table(Dwarf_Hash_Table htin,
    Dwarf_Hash_Table htout)
{
    Dwarf_Abbrev_List *entry_in  = htin->tb_entries;
    unsigned long      entry_in_count  = htin->tb_table_entry_count;
    Dwarf_Abbrev_List *entry_out = htout->tb_entries;
    unsigned long      entry_out_count = htout->tb_table_entry_count;
    unsigned long k = 0;

    for (k = 0; k < entry_in_count; ++k) {
        Dwarf_Abbrev_List listent = entry_in[k];
        Dwarf_Abbrev_List nextlistent = 0;
        for (; listent ; listent = nextlistent) {
            Dwarf_Unsigned newtmp = listent->abl_code;
            Dwarf_Unsigned newhash = newtmp HT_MOD_OP
                (entry_out_count -1);

            nextlistent = listent->abl_next;
            /*  Move_entry_to_new_hash. This reverses the
                order of the entries, effectively, but
                that does not seem significant. */
            if (newhash > htout->tb_highest_used_entry) {
                htout->tb_highest_used_entry =
                    (unsigned long)newhash;
            }
            listent->abl_next = entry_out[newhash];
            entry_out[newhash] = listent;
            htout->tb_total_abbrev_count++;
        }
    }
}